

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O1

ostream * operator<<(ostream *os,
                    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                    *kv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string key;
  UniValue val;
  long in_FS_OFFSET;
  SettingsValue out;
  char *in_stack_fffffffffffffeb8;
  _Alloc_hider in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffedc;
  pointer pbVar4;
  pointer in_stack_fffffffffffffee8;
  _Alloc_hider in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef8 [56];
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = local_a0;
  local_a8 = 0;
  paVar1 = &local_90.val.field_2;
  local_90.typ = VOBJ;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_a0._1_8_;
  local_90.val.field_2._M_local_buf[8] = SUB81(local_a0._1_8_,7);
  local_90.val._M_string_length = 0;
  local_a0[0] = 0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0[0] = local_c0;
  pcVar2 = (kv->first)._M_dataplus._M_p;
  local_90.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar2,pcVar2 + (kv->first)._M_string_length);
  uVar3 = (kv->second).typ;
  pcVar2 = (kv->second).val._M_dataplus._M_p;
  pbVar4 = (pointer)&stack0xfffffffffffffef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffee0,pcVar2,pcVar2 + (kv->second).val._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xffffffffffffff00,&(kv->second).keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff18,
             &(kv->second).values);
  key._M_string_length = (size_type)in_stack_fffffffffffffec0._M_p;
  key._M_dataplus._M_p = in_stack_fffffffffffffeb8;
  key.field_2._M_allocated_capacity = in_stack_fffffffffffffec8;
  key.field_2._8_8_ = in_stack_fffffffffffffed0;
  val._4_4_ = in_stack_fffffffffffffedc;
  val.typ = uVar3;
  val.val._M_dataplus._M_p = (pointer)pbVar4;
  val.val._M_string_length = (size_type)in_stack_fffffffffffffee8;
  val.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffef0._M_p;
  val._32_56_ = in_stack_fffffffffffffef8;
  UniValue::pushKVEnd(&local_90,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffff00);
  if (pbVar4 != (pointer)&stack0xfffffffffffffef0) {
    operator_delete(pbVar4,(ulong)(in_stack_fffffffffffffef0._M_p + 1));
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  UniValue::write_abi_cxx11_((UniValue *)&stack0xfffffffffffffeb8,(int)&local_90,(void *)0x0,0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,in_stack_fffffffffffffeb8,(long)in_stack_fffffffffffffec0._M_p);
  if (in_stack_fffffffffffffeb8 != &stack0xfffffffffffffec8) {
    operator_delete(in_stack_fffffffffffffeb8,in_stack_fffffffffffffec8 + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return os;
  }
  __stack_chk_fail();
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, const std::pair<std::string, common::SettingsValue>& kv)
{
    common::SettingsValue out(common::SettingsValue::VOBJ);
    out.pushKVEnd(kv.first, kv.second);
    os << out.write();
    return os;
}